

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void nn_timer_init(nn_timer *self,int src,nn_fsm *owner)

{
  nn_worker *pnVar1;
  
  nn_fsm_init(&self->fsm,nn_timer_handler,nn_timer_shutdown,src,self,owner);
  self->state = 1;
  nn_worker_task_init(&self->start_task,1,&self->fsm);
  nn_worker_task_init(&self->stop_task,2,&self->fsm);
  nn_worker_timer_init(&self->wtimer,&self->fsm);
  nn_fsm_event_init(&self->done);
  pnVar1 = nn_fsm_choose_worker(&self->fsm);
  self->worker = pnVar1;
  self->timeout = -1;
  return;
}

Assistant:

void nn_timer_init (struct nn_timer *self, int src, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_timer_handler, nn_timer_shutdown,
        src, self, owner);
    self->state = NN_TIMER_STATE_IDLE;
    nn_worker_task_init (&self->start_task, NN_TIMER_SRC_START_TASK,
        &self->fsm);
    nn_worker_task_init (&self->stop_task, NN_TIMER_SRC_STOP_TASK, &self->fsm);
    nn_worker_timer_init (&self->wtimer, &self->fsm);
    nn_fsm_event_init (&self->done);
    self->worker = nn_fsm_choose_worker (&self->fsm);
    self->timeout = -1;
}